

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

Vec_Int_t * Cnf_DataCollectPiSatNums(Cnf_Dat_t *pCnf,Aig_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  void *pvVar2;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vCiIds;
  Aig_Man_t *p_local;
  Cnf_Dat_t *pCnf_local;
  
  iVar1 = Aig_ManCiNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,local_2c);
    Vec_IntPush(p_00,pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)]);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Cnf_DataCollectPiSatNums( Cnf_Dat_t * pCnf, Aig_Man_t * p )
{
    Vec_Int_t * vCiIds;
    Aig_Obj_t * pObj;
    int i;
    vCiIds = Vec_IntAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vCiIds, pCnf->pVarNums[pObj->Id] );
    return vCiIds;
}